

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

int Mf_CutRef_rec(Mf_Man_t *p,int *pCut)

{
  Jf_Par_t *pJVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar3 = *pCut & 0x1f;
  iVar4 = 0;
  if (1 < uVar3) {
    pJVar1 = p->pPars;
    if (pJVar1->fGenCnf == 0) {
      if (pJVar1->fOptEdge == 0) {
        iVar4 = 1;
      }
      else {
        iVar4 = uVar3 + pJVar1->nAreaTuner;
      }
    }
    else {
      uVar3 = (uint)*pCut >> 6;
      if ((p->vCnfSizes).nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = (p->vCnfSizes).pArray[uVar3];
    }
  }
  if ((*pCut & 0x1f) != 0) {
    uVar5 = 0;
    do {
      uVar3 = *(uint *)&p->pLfObjs[pCut[uVar5 + 1]].field_0xc;
      *(short *)&p->pLfObjs[pCut[uVar5 + 1]].field_0xe =
           (short)((uVar3 & 0xffff0000) + 0x10000 >> 0x10);
      if ((uVar3 < 0x10000) && (iVar2 = p->pLfObjs[pCut[uVar5 + 1]].iCutSet, iVar2 != 0)) {
        uVar3 = iVar2 >> 0x10;
        if (((int)uVar3 < 0) || ((p->vPages).nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar2 = Mf_CutRef_rec(p,(int *)((long)(p->vPages).pArray[uVar3] +
                                       (ulong)(ushort)iVar2 * 4 + 4));
        iVar4 = iVar4 + iVar2;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (*pCut & 0x1f));
  }
  return iVar4;
}

Assistant:

int Mf_CutRef_rec( Mf_Man_t * p, int * pCut )
{
    int i, Count = Mf_CutArea(p, Mf_CutSize(pCut), Mf_CutFunc(pCut));
    for ( i = 1; i <= Mf_CutSize(pCut); i++ )
        if ( !Mf_ObjMapRefInc(p, pCut[i]) && Mf_ManObj(p, pCut[i])->iCutSet )
            Count += Mf_CutRef_rec( p, Mf_ObjCutBest(p, pCut[i]) );
    return Count;
}